

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

idx_t duckdb::SortKeyVarcharOperator::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  data_ptr_t pdVar1;
  Vector *pVVar2;
  data_t dVar3;
  undefined7 in_register_00000009;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  Vector *vector;
  anon_struct_16_3_d7536bce_for_pointer aVar6;
  
  pdVar1 = result->data;
  dVar3 = 0xff;
  if ((int)CONCAT71(in_register_00000009,flip_bytes) == 0) {
    dVar3 = '\0';
  }
  pVVar2 = (Vector *)0x0;
  do {
    vector = pVVar2;
    pVVar2 = (Vector *)&vector->field_0x1;
  } while (dVar3 != input[(long)vector]);
  aVar6 = (anon_struct_16_3_d7536bce_for_pointer)
          StringVector::EmptyString((StringVector *)result,vector,result_idx);
  pdVar4 = pdVar1 + result_idx * 0x10 + 4;
  ((anon_union_16_2_67f50693_for_value *)(pdVar4 + -4))->pointer = aVar6;
  pdVar5 = (data_ptr_t)aVar6.ptr;
  if (aVar6.length < 0xd) {
    pdVar5 = pdVar4;
  }
  for (pVVar2 = (Vector *)0x0; vector != pVVar2; pVVar2 = (Vector *)&pVVar2->field_0x1) {
    dVar3 = input[(long)pVVar2] + 0xff;
    if (flip_bytes) {
      dVar3 = 0xfe - input[(long)pVVar2];
    }
    pdVar5[(long)pVVar2] = dVar3;
  }
  string_t::Finalize((string_t *)(pdVar1 + result_idx * 0x10));
  return (idx_t)&vector->field_0x1;
}

Assistant:

static idx_t Decode(const_data_ptr_t input, Vector &result, idx_t result_idx, bool flip_bytes) {
		auto result_data = FlatVector::GetData<TYPE>(result);
		// iterate until we encounter the string delimiter to figure out the string length
		data_t string_delimiter = SortKeyVectorData::STRING_DELIMITER;
		if (flip_bytes) {
			string_delimiter = ~string_delimiter;
		}
		idx_t pos;
		for (pos = 0; input[pos] != string_delimiter; pos++) {
		}
		idx_t str_len = pos;
		// now allocate the string data and fill it with the decoded data
		result_data[result_idx] = StringVector::EmptyString(result, str_len);
		auto str_data = data_ptr_cast(result_data[result_idx].GetDataWriteable());
		for (pos = 0; pos < str_len; pos++) {
			if (flip_bytes) {
				str_data[pos] = (~input[pos]) - 1;
			} else {
				str_data[pos] = input[pos] - 1;
			}
		}
		result_data[result_idx].Finalize();
		return pos + 1;
	}